

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O2

psa_status_t
psa_get_key_from_slot
          (psa_key_handle_t handle,psa_key_slot_t **p_slot,psa_key_usage_t usage,psa_algorithm_t alg
          )

{
  psa_key_slot_t *ppVar1;
  psa_status_t pVar2;
  int iVar3;
  uint uVar4;
  psa_key_slot_t *slot;
  psa_key_slot_t *local_30;
  
  local_30 = (psa_key_slot_t *)0x0;
  *p_slot = (psa_key_slot_t *)0x0;
  pVar2 = psa_get_key_slot(handle,&local_30);
  ppVar1 = local_30;
  if (pVar2 == 0) {
    uVar4 = usage & 0xfffffffe;
    if (((local_30->attr).type & 0x7000) != 0x4000) {
      uVar4 = usage;
    }
    pVar2 = -0x85;
    if ((uVar4 & ~(local_30->attr).policy.usage) == 0) {
      if (((alg != 0) &&
          (iVar3 = psa_key_algorithm_permits((local_30->attr).policy.alg,alg), iVar3 == 0)) &&
         (iVar3 = psa_key_algorithm_permits((ppVar1->attr).policy.alg2,alg), iVar3 == 0)) {
        return -0x85;
      }
      *p_slot = ppVar1;
      pVar2 = 0;
    }
  }
  return pVar2;
}

Assistant:

static psa_status_t psa_get_key_from_slot( psa_key_handle_t handle,
                                           psa_key_slot_t **p_slot,
                                           psa_key_usage_t usage,
                                           psa_algorithm_t alg )
{
    psa_status_t status;
    psa_key_slot_t *slot = NULL;

    *p_slot = NULL;

    status = psa_get_key_slot( handle, &slot );
    if( status != PSA_SUCCESS )
        return( status );

    /* Enforce that usage policy for the key slot contains all the flags
     * required by the usage parameter. There is one exception: public
     * keys can always be exported, so we treat public key objects as
     * if they had the export flag. */
    if( PSA_KEY_TYPE_IS_PUBLIC_KEY( slot->attr.type ) )
        usage &= ~PSA_KEY_USAGE_EXPORT;
    if( ( slot->attr.policy.usage & usage ) != usage )
        return( PSA_ERROR_NOT_PERMITTED );

    /* Enforce that the usage policy permits the requested algortihm. */
    if( alg != 0 && ! psa_key_policy_permits( &slot->attr.policy, alg ) )
        return( PSA_ERROR_NOT_PERMITTED );

    *p_slot = slot;
    return( PSA_SUCCESS );
}